

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
node::BlockManager::ReadBlockFromDisk(BlockManager *this,CBlock *block,FlatFilePos *pos)

{
  CChainParams *consensusParams;
  uint256 hash;
  base_blob<256U> *pbVar1;
  bool bVar2;
  bool bVar3;
  FILE *pFVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  char *in_stack_ffffffffffffff30;
  char (*in_stack_ffffffffffffff38) [18];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  AutoFile local_a8;
  TransactionSerParams *local_88;
  AutoFile *local_80;
  undefined1 local_78 [16];
  char (*local_68) [18];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)
   ((block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  (block->super_CBlockHeader).nBits = 0;
  (block->super_CBlockHeader).nNonce = 0;
  pbVar1 = &(block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0xc] = '\0';
  (pbVar1->m_data)._M_elems[0xd] = '\0';
  (pbVar1->m_data)._M_elems[0xe] = '\0';
  (pbVar1->m_data)._M_elems[0xf] = '\0';
  (pbVar1->m_data)._M_elems[0x10] = '\0';
  (pbVar1->m_data)._M_elems[0x11] = '\0';
  (pbVar1->m_data)._M_elems[0x12] = '\0';
  (pbVar1->m_data)._M_elems[0x13] = '\0';
  pbVar1 = &(block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0x14] = '\0';
  (pbVar1->m_data)._M_elems[0x15] = '\0';
  (pbVar1->m_data)._M_elems[0x16] = '\0';
  (pbVar1->m_data)._M_elems[0x17] = '\0';
  (pbVar1->m_data)._M_elems[0x18] = '\0';
  (pbVar1->m_data)._M_elems[0x19] = '\0';
  (pbVar1->m_data)._M_elems[0x1a] = '\0';
  (pbVar1->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   ((block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c) = 0;
  pbVar1 = &(block->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[4] = '\0';
  (pbVar1->m_data)._M_elems[5] = '\0';
  (pbVar1->m_data)._M_elems[6] = '\0';
  (pbVar1->m_data)._M_elems[7] = '\0';
  (pbVar1->m_data)._M_elems[8] = '\0';
  (pbVar1->m_data)._M_elems[9] = '\0';
  (pbVar1->m_data)._M_elems[10] = '\0';
  (pbVar1->m_data)._M_elems[0xb] = '\0';
  pbVar1 = &(block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0xc] = '\0';
  (pbVar1->m_data)._M_elems[0xd] = '\0';
  (pbVar1->m_data)._M_elems[0xe] = '\0';
  (pbVar1->m_data)._M_elems[0xf] = '\0';
  (pbVar1->m_data)._M_elems[0x10] = '\0';
  (pbVar1->m_data)._M_elems[0x11] = '\0';
  (pbVar1->m_data)._M_elems[0x12] = '\0';
  (pbVar1->m_data)._M_elems[0x13] = '\0';
  pbVar1 = &(block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[0x14] = '\0';
  (pbVar1->m_data)._M_elems[0x15] = '\0';
  (pbVar1->m_data)._M_elems[0x16] = '\0';
  (pbVar1->m_data)._M_elems[0x17] = '\0';
  (pbVar1->m_data)._M_elems[0x18] = '\0';
  (pbVar1->m_data)._M_elems[0x19] = '\0';
  (pbVar1->m_data)._M_elems[0x1a] = '\0';
  (pbVar1->m_data)._M_elems[0x1b] = '\0';
  (block->super_CBlockHeader).nVersion = 0;
  (block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  (block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  (block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  (block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pbVar1 = &(block->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>;
  (pbVar1->m_data)._M_elems[4] = '\0';
  (pbVar1->m_data)._M_elems[5] = '\0';
  (pbVar1->m_data)._M_elems[6] = '\0';
  (pbVar1->m_data)._M_elems[7] = '\0';
  (pbVar1->m_data)._M_elems[8] = '\0';
  (pbVar1->m_data)._M_elems[9] = '\0';
  (pbVar1->m_data)._M_elems[10] = '\0';
  (pbVar1->m_data)._M_elems[0xb] = '\0';
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear(&block->vtx);
  block->fChecked = false;
  block->m_checked_witness_commitment = false;
  block->m_checked_merkle_root = false;
  pFVar4 = FlatFileSeq::Open(&this->m_block_file_seq,pos,true);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&local_58,&this->m_xor_key);
  local_a8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = local_58._M_dataplus._M_p._0_4_;
  local_a8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = local_58._M_dataplus._M_p._4_4_;
  local_a8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = (undefined4)local_58._M_string_length;
  local_a8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = local_58._M_string_length._4_4_;
  local_a8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_58.field_2._M_allocated_capacity;
  local_a8.m_file = pFVar4;
  if (pFVar4 == (FILE *)0x0) {
    FlatFilePos::ToString_abi_cxx11_(&local_58,pos);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "ReadBlockFromDisk";
    logging_function_00._M_len = 0x11;
    LogPrintf_<char[18],std::__cxx11::string>
              (logging_function_00,source_file_00,0x414,
               IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|PRUNE|RAND|CMPCTBLOCK|HTTP|TOR|NET,
               (Level)&local_58,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff40);
  }
  else {
    local_88 = &::TX_WITH_WITNESS;
    local_80 = &local_a8;
    CBlock::SerializationOps<ParamsStream<AutoFile&,TransactionSerParams>,CBlock,ActionUnserialize>
              (block);
    CBlockHeader::GetHash((uint256 *)local_78,&block->super_CBlockHeader);
    hash.super_base_blob<256U>.m_data._M_elems[8] = local_78[8];
    hash.super_base_blob<256U>.m_data._M_elems[9] = local_78[9];
    hash.super_base_blob<256U>.m_data._M_elems[10] = local_78[10];
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = local_78[0xb];
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = local_78[0xc];
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = local_78[0xd];
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = local_78[0xe];
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = local_78[0xf];
    hash.super_base_blob<256U>.m_data._M_elems[0] = local_78[0];
    hash.super_base_blob<256U>.m_data._M_elems[1] = local_78[1];
    hash.super_base_blob<256U>.m_data._M_elems[2] = local_78[2];
    hash.super_base_blob<256U>.m_data._M_elems[3] = local_78[3];
    hash.super_base_blob<256U>.m_data._M_elems[4] = local_78[4];
    hash.super_base_blob<256U>.m_data._M_elems[5] = local_78[5];
    hash.super_base_blob<256U>.m_data._M_elems[6] = local_78[6];
    hash.super_base_blob<256U>.m_data._M_elems[7] = local_78[7];
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = local_68;
    hash.super_base_blob<256U>.m_data._M_elems._24_8_ = pbStack_60;
    bVar2 = CheckProofOfWork(hash,(block->super_CBlockHeader).nBits,
                             &((this->m_opts).chainparams)->consensus);
    if (bVar2) {
      consensusParams = (this->m_opts).chainparams;
      bVar2 = true;
      if ((consensusParams->consensus).signet_blocks != true) goto LAB_009209d8;
      bVar3 = CheckSignetBlockSolution(block,&consensusParams->consensus);
      if (bVar3) goto LAB_009209d8;
      FlatFilePos::ToString_abi_cxx11_(&local_58,pos);
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x5e;
      logging_function._M_str = "ReadBlockFromDisk";
      logging_function._M_len = 0x11;
      LogPrintf_<char[18],std::__cxx11::string>
                (logging_function,source_file,0x428,
                 IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|PRUNE|RAND|CMPCTBLOCK|WALLETDB|HTTP|MEMPOOL|
                 TOR,(Level)&local_58,(char *)local_78._8_8_,local_68,pbStack_60);
    }
    else {
      FlatFilePos::ToString_abi_cxx11_(&local_58,pos);
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file_01._M_len = 0x5e;
      logging_function_01._M_str = "ReadBlockFromDisk";
      logging_function_01._M_len = 0x11;
      LogPrintf_<char[18],std::__cxx11::string>
                (logging_function_01,source_file_01,0x422,
                 IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|PRUNE|RAND|CMPCTBLOCK|ZMQ|HTTP|MEMPOOL,
                 (Level)&local_58,(char *)local_78._8_8_,local_68,pbStack_60);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_) !=
      &local_58.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_58._M_dataplus._M_p._4_4_,local_58._M_dataplus._M_p._0_4_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  bVar2 = false;
LAB_009209d8:
  AutoFile::~AutoFile(&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadBlockFromDisk(CBlock& block, const FlatFilePos& pos) const
{
    block.SetNull();

    // Open history file to read
    AutoFile filein{OpenBlockFile(pos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    // Read block
    try {
        filein >> TX_WITH_WITNESS(block);
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s at %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    // Check the header
    if (!CheckProofOfWork(block.GetHash(), block.nBits, GetConsensus())) {
        LogError("%s: Errors in block header at %s\n", __func__, pos.ToString());
        return false;
    }

    // Signet only: check block solution
    if (GetConsensus().signet_blocks && !CheckSignetBlockSolution(block, GetConsensus())) {
        LogError("%s: Errors in block solution at %s\n", __func__, pos.ToString());
        return false;
    }

    return true;
}